

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_ProStringList>_>::rehash
          (Data<QHashPrivate::Node<QString,_ProStringList>_> *this,size_t sizeHint)

{
  uchar *puVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  Data *pDVar8;
  ProString *pPVar9;
  Node<QString,_ProStringList> *pNVar10;
  ulong uVar11;
  size_t index;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  QStringView QVar16;
  R RVar17;
  Bucket BVar18;
  Span *local_48;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar13 = 0x80;
  if ((0x40 < sizeHint) && (sVar13 = 0xffffffffffffffff, sizeHint < 0x4000000000000000)) {
    lVar12 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    sVar13 = 1L << (0x41 - ((byte)lVar12 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar17 = allocateSpans(sVar13);
  this->spans = (Span *)RVar17.spans;
  this->numBuckets = sVar13;
  if (0x7f < uVar2) {
    uVar11 = 0;
    local_48 = pSVar3;
    do {
      lVar12 = 0;
      do {
        if (local_48->offsets[lVar12] != 0xff) {
          pEVar4 = pSVar3[uVar11].entries;
          uVar14 = (ulong)((uint)local_48->offsets[lVar12] * 0x30);
          QVar16.m_data = *(storage_type_conflict **)((pEVar4->storage).data + uVar14 + 8);
          QVar16.m_size = *(qsizetype *)((pEVar4->storage).data + uVar14 + 0x10);
          sVar13 = qHash(QVar16,this->seed);
          BVar18 = findBucketWithHash<QString>
                             (this,(QString *)((pEVar4->storage).data + uVar14),sVar13);
          pNVar10 = Span<QHashPrivate::Node<QString,_ProStringList>_>::insert
                              (BVar18.span,BVar18.index);
          pDVar5 = *(Data **)((pEVar4->storage).data + uVar14);
          puVar1 = (pEVar4->storage).data + uVar14;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar10->key).d.d = pDVar5;
          pcVar6 = *(char16_t **)((pEVar4->storage).data + uVar14 + 8);
          puVar1 = (pEVar4->storage).data + uVar14 + 8;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar10->key).d.ptr = pcVar6;
          qVar7 = *(qsizetype *)((pEVar4->storage).data + uVar14 + 0x10);
          puVar1 = (pEVar4->storage).data + uVar14 + 0x10;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar10->key).d.size = qVar7;
          pDVar8 = *(Data **)((pEVar4->storage).data + uVar14 + 0x18);
          puVar1 = (pEVar4->storage).data + uVar14 + 0x18;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar10->value).super_QList<ProString>.d.d = pDVar8;
          pPVar9 = *(ProString **)((pEVar4->storage).data + uVar14 + 0x20);
          puVar1 = (pEVar4->storage).data + uVar14 + 0x20;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar10->value).super_QList<ProString>.d.ptr = pPVar9;
          qVar7 = *(qsizetype *)((pEVar4->storage).data + uVar14 + 0x28);
          puVar1 = (pEVar4->storage).data + uVar14 + 0x28;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar10->value).super_QList<ProString>.d.size = qVar7;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x80);
      Span<QHashPrivate::Node<QString,_ProStringList>_>::freeData(pSVar3 + uVar11);
      uVar11 = uVar11 + 1;
      local_48 = local_48 + 1;
    } while (uVar11 != uVar2 >> 7);
  }
  if (pSVar3 != (Span *)0x0) {
    lVar12 = *(long *)&pSVar3[-1].allocated;
    if (lVar12 != 0) {
      lVar15 = lVar12 * 0x90;
      do {
        Span<QHashPrivate::Node<QString,_ProStringList>_>::freeData
                  ((Span<QHashPrivate::Node<QString,_ProStringList>_> *)
                   (pSVar3[-1].offsets + lVar15));
        lVar15 = lVar15 + -0x90;
      } while (lVar15 != 0);
    }
    operator_delete__(&pSVar3[-1].allocated,lVar12 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }